

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ECUPort.cc
# Opt level: O2

void SSM::ECUPort::configurePort(int *file)

{
  int iVar1;
  DeviceException *pDVar2;
  int *piVar3;
  char *pcVar4;
  allocator<char> local_99;
  string local_98;
  string local_78;
  termios local_58;
  
  local_58.c_cc[0x1f] = '\0';
  local_58._49_3_ = 0;
  local_58.c_ispeed = 0;
  local_58.c_ospeed = 0;
  local_58.c_cc[0xf] = '\0';
  local_58.c_cc[0x10] = '\0';
  local_58.c_cc[0x11] = '\0';
  local_58.c_cc[0x12] = '\0';
  local_58.c_cc[0x13] = '\0';
  local_58.c_cc[0x14] = '\0';
  local_58.c_cc[0x15] = '\0';
  local_58.c_cc[0x16] = '\0';
  local_58.c_cc[0x17] = '\0';
  local_58.c_cc[0x18] = '\0';
  local_58.c_cc[0x19] = '\0';
  local_58.c_cc[0x1a] = '\0';
  local_58.c_cc[0x1b] = '\0';
  local_58.c_cc[0x1c] = '\0';
  local_58.c_cc[0x1d] = '\0';
  local_58.c_cc[0x1e] = '\0';
  local_58.c_line = '\0';
  local_58.c_cc[0] = '\0';
  local_58.c_cc[1] = '\0';
  local_58.c_cc[2] = '\0';
  local_58.c_cc[3] = '\0';
  local_58.c_cc[4] = '\0';
  local_58.c_cc[5] = '\0';
  local_58.c_cc[6] = '\0';
  local_58.c_cc[7] = '\0';
  local_58.c_cc[8] = '\0';
  local_58.c_cc[9] = '\0';
  local_58.c_cc[10] = '\0';
  local_58.c_cc[0xb] = '\0';
  local_58.c_cc[0xc] = '\0';
  local_58.c_cc[0xd] = '\0';
  local_58.c_cc[0xe] = '\0';
  local_58.c_iflag = 0;
  local_58.c_oflag = 0;
  local_58.c_cflag = 0;
  local_58.c_lflag = 0;
  iVar1 = tcgetattr(*file,&local_58);
  if (iVar1 != 0) {
    pDVar2 = (DeviceException *)__cxa_allocate_exception(0x28);
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,pcVar4,&local_99);
    DeviceException::DeviceException(pDVar2,&local_78);
    __cxa_throw(pDVar2,&DeviceException::typeinfo,Exception::~Exception);
  }
  local_58._8_8_ = local_58._8_8_ & 0xffffffa47ffff60f | 0x8b0;
  local_58.c_cc._5_2_ = 0x14;
  local_58._0_8_ = local_58._0_8_ & 0xfffffffaffffe214;
  cfsetispeed(&local_58,0xc);
  iVar1 = tcsetattr(*file,0,&local_58);
  if (iVar1 == 0) {
    return;
  }
  pDVar2 = (DeviceException *)__cxa_allocate_exception(0x28);
  piVar3 = __errno_location();
  pcVar4 = strerror(*piVar3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,pcVar4,&local_99);
  DeviceException::DeviceException(pDVar2,&local_98);
  __cxa_throw(pDVar2,&DeviceException::typeinfo,Exception::~Exception);
}

Assistant:

void ECUPort::configurePort(const int& file)
  {
    // Read in existing settings
    struct termios tty; memset(&tty, 0, sizeof tty);
    if(tcgetattr(file, &tty)) throw(DeviceException(strerror(errno)));

    // Modify settings
    tty.c_cflag &= ~PARENB;        // Clear parity bit: disable parity
    tty.c_cflag &= ~CSTOPB;        // Use one stop bit
    tty.c_cflag |= CS8;            // 8 bits per byte
    tty.c_cflag &= ~CRTSCTS;       // Disable RTS/CTS hardware flow control
    tty.c_cflag |= CREAD | CLOCAL; // Turn on READ & ignore ctrl lines (CLOCAL = 1)
    tty.c_lflag &= ~ICANON;        // Disable canonical mode
    tty.c_lflag &= ~ECHO;          // Disable echo
    tty.c_lflag &= ~ECHOE;         // Disable erasure
    tty.c_lflag &= ~ECHONL;        // Disable new-line echo
    tty.c_lflag &= ~ISIG;          // Disable INTR, QUIT and SUSP
    tty.c_iflag &= ~IXON;          // Turn off software flow control
    tty.c_iflag &= ~IXOFF;
    tty.c_iflag &= ~IXANY;
    tty.c_iflag &= ~IGNBRK;        // Don't handle incoming bytes, get raw data
    tty.c_iflag &= ~BRKINT;
    tty.c_iflag &= ~PARMRK;
    tty.c_iflag &= ~ISTRIP;
    tty.c_iflag &= ~INLCR;
    tty.c_iflag &= ~IGNCR;
    tty.c_iflag &= ~ICRNL;

    tty.c_cc[VTIME] = 20;     // Return as soon as any data is received,
    tty.c_cc[VMIN]  = 0;      // subject to timeout of 2s (20 deciseconds)
    tty.c_oflag &= ~OPOST;    // No special interpretation of output bytes
    tty.c_oflag &= ~ONLCR;    // Noconversion of newline to carriage return/line feed
    cfsetispeed(&tty, B4800); // Set Baud rate to 4800

    // Pass settings back to port
    if (tcsetattr(file, TCSANOW, &tty))
      throw(DeviceException(strerror(errno)));
  }